

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O0

void __thiscall
randomRoundTrip_basic_Test::randomRoundTrip_basic_Test(randomRoundTrip_basic_Test *this)

{
  randomRoundTrip_basic_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__randomRoundTrip_basic_Test_002171a0;
  return;
}

Assistant:

TEST(randomRoundTrip, basic)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        std::default_random_engine engine(
            std::chrono::system_clock::now().time_since_epoch().count());
        std::uniform_int_distribution<unsigned int> distribution(
            0, std::numeric_limits<unsigned int>::max());

        for (auto ii = 0; ii < 6000; ++ii) {
            auto start = distribution(engine);
            detail::unit_data unitdata(nullptr);
            memcpy(static_cast<void*>(&unitdata), &start, 4);
            auto startunit = unit(unitdata);
            auto str = to_string(startunit);
            auto resunit = unit_cast(unit_from_string(str));
            EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
        }
    }
}